

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-dark.c
# Opt level: O2

_Bool borg_flow_dark_interesting(int y,int x,int b_stair)

{
  byte feat;
  long lVar1;
  _Bool _Var2;
  uint uVar3;
  wchar_t feat_00;
  long lVar4;
  ulong uVar5;
  ushort uVar6;
  long lVar7;
  borg_grid *pbVar8;
  bool bVar9;
  
  feat = borg_grids[y][x].feat;
  feat_00 = (wchar_t)feat;
  if (feat == 0) {
    return true;
  }
  if (feat < 0xf && feat != 2) {
    return false;
  }
  pbVar8 = borg_grids[y] + x;
  uVar3 = (uint)feat;
  if (uVar3 < 0x16) {
    if ((0x260000U >> (uVar3 & 0x1f) & 1) == 0) {
      if ((0x180000U >> (uVar3 & 0x1f) & 1) != 0) {
        if (borg.trait[0x72] != 0) {
          return false;
        }
        if (99999 < borg.trait[0x2d]) {
          return false;
        }
        if (borg.trait[0x1a] == 0) {
          return false;
        }
        _Var2 = borg_can_dig(false,feat);
        return _Var2;
      }
    }
    else {
      if (borg.trait[0x72] != 0) {
        return false;
      }
      if (!vault_on_level) {
        return false;
      }
      _Var2 = borg_can_dig(false,feat);
      if (!_Var2) {
        return false;
      }
      if (y - 2U < 0x3f && x - 2U < 0xc3) {
        for (lVar4 = -1; lVar7 = -1, lVar4 != 2; lVar4 = lVar4 + 1) {
          while (lVar7 != 2) {
            lVar1 = y + lVar7;
            lVar7 = lVar7 + 1;
            if (borg_grids[lVar1][lVar4 + x].feat == '\x16') {
              return true;
            }
          }
        }
      }
      pbVar8 = borg_grids[y] + x;
      feat_00 = (wchar_t)borg_grids[y][x].feat;
    }
  }
  if ((char)feat_00 == '\x02') {
    if (breeder_level != true) {
      return true;
    }
    uVar5 = 0;
    uVar6 = track_door.num;
    if ((short)uVar6 < 1) {
      uVar6 = 0;
    }
    while( true ) {
      bVar9 = uVar6 == uVar5;
      if (bVar9) {
        return bVar9;
      }
      if ((track_door.x[uVar5] == x) && (track_door.y[uVar5] == y)) break;
      uVar5 = uVar5 + 1;
    }
    return bVar9;
  }
  if ((feat_00 == L'\x10') && (borg.trait[0x6c] == 0)) {
    return true;
  }
  _Var2 = feat_is_trap_holding(feat_00);
  if ((((((_Var2) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       ((borg.trait[0x78] == 0 && (borg.trait[0x1a] != 0)))) &&
      ((borg.trait[0x69] != 99 || ((pbVar8->trap != true || (pbVar8->glyph == true)))))) &&
     (0x3b < borg.trait[0x1b])) {
    if (borg.trait[0x36] < 0x1e) {
      if (borg.trait[0x23] < 0x14) {
        return false;
      }
    }
    else if (((uint)borg.trait[0x36] < 0x2d) && (borg.trait[0x23] < 10)) {
      return false;
    }
    if (borg.trait[0x37] < 0x1e) {
      if (0x13 < borg.trait[0x23]) {
LAB_00205b9e:
        return (_Bool)(scaryguy_on_level ^ 1);
      }
    }
    else if ((0x2c < (uint)borg.trait[0x37]) || (9 < borg.trait[0x23])) goto LAB_00205b9e;
  }
  return false;
}

Assistant:

static bool borg_flow_dark_interesting(int y, int x, int b_stair)
{
    int oy;
    int ox, i;

    borg_grid *ag;

    /* Get the borg_grid */
    ag = &borg_grids[y][x];

    /* Explore unknown grids */
    if (ag->feat == FEAT_NONE)
        return true;

    /* Efficiency -- Ignore "boring" grids */
    if (ag->feat < FEAT_SECRET && ag->feat != FEAT_CLOSED)
        return false;

    /* Explore "known treasure" */
    if ((ag->feat == FEAT_MAGMA_K) || (ag->feat == FEAT_QUARTZ_K)) {
        /* Do not dig when confused */
        if (borg.trait[BI_ISCONFUSED])
            return false;

        /* Do not bother if super rich */
        if (borg.trait[BI_GOLD] >= 100000)
            return false;

        /* Not when darkened */
        if (borg.trait[BI_LIGHT] == 0)
            return false;

        /* don't try to dig if we can't */
        if (!borg_can_dig(false, ag->feat))
            return false;

        /* Okay */
        return true;
    }

    /* "Vaults" Explore non perma-walls adjacent to a perma wall */
    if (ag->feat == FEAT_GRANITE || ag->feat == FEAT_MAGMA
        || ag->feat == FEAT_QUARTZ) {

        /* Do not attempt when confused */
        if (borg.trait[BI_ISCONFUSED])
            return false;

        /* hack and cheat.  No vaults  on this level */
        if (!vault_on_level)
            return false;

        /* make sure we can dig */
        if (!borg_can_dig(false, ag->feat))
            return false;

        /* Do not attempt on the edge */
        if (x < AUTO_MAX_X - 1 && y < AUTO_MAX_Y - 1 && x > 1 && y > 1) {
            /* scan the adjacent grids */
            for (ox = -1; ox <= 1; ox++) {
                for (oy = -1; oy <= 1; oy++) {

                    /* Acquire location */
                    ag = &borg_grids[oy + y][ox + x];

                    /* skip non perma grids wall */
                    if (ag->feat != FEAT_PERM)
                        continue;

                    /* at least one perm wall next to this, dig it out */
                    return true;
                }
            }
        }

        /* not adjacent to a GCV,  Restore Grid */
        ag = &borg_grids[y][x];
    }

    /* Explore "rubble" */
    if (ag->feat == FEAT_RUBBLE && !borg.trait[BI_ISWEAK]) {
        return true;
    }

    /* Explore "closed doors" */
    if (ag->feat == FEAT_CLOSED) {
        /* some closed doors leave alone */
        if (breeder_level) {
            /* Did I close this one */
            for (i = 0; i < track_door.num; i++) {
                /* mark as icky if I closed this one */
                if ((track_door.x[i] == x) && (track_door.y[i] == y)) {
                    /* not interesting */
                    return false;
                }
            }
        }
        /* this door should be ok to open */
        return true;
    }

    /* Explore "visible traps" */
    if (feat_is_trap_holding(ag->feat)) {
        /* Do not disarm when blind */
        if (borg.trait[BI_ISBLIND])
            return false;

        /* Do not disarm when confused */
        if (borg.trait[BI_ISCONFUSED])
            return false;

        /* Do not disarm when hallucinating */
        if (borg.trait[BI_ISIMAGE])
            return false;

        /* Do not flow without lite */
        if (borg.trait[BI_LIGHT] == 0)
            return false;

        /* Do not disarm trap doors on level 99 */
        if (borg.trait[BI_CDEPTH] == 99 && ag->trap && !ag->glyph)
            return false;

        /* Do not disarm when you could end up dead */
        if (borg.trait[BI_CURHP] < 60)
            return false;

        /* Do not disarm when clumsy */
        if (borg.trait[BI_DISP] < 30 && borg.trait[BI_CLEVEL] < 20)
            return false;
        if (borg.trait[BI_DISP] < 45 && borg.trait[BI_CLEVEL] < 10)
            return false;
        if (borg.trait[BI_DISM] < 30 && borg.trait[BI_CLEVEL] < 20)
            return false;
        if (borg.trait[BI_DISM] < 45 && borg.trait[BI_CLEVEL] < 10)
            return false;

        /* Do not explore if a Scaryguy on the Level */
        if (scaryguy_on_level)
            return false;

        /* NOTE: the flow code allows a borg to flow through a trap and so he
         * may still try to disarm one on his way to the other interesting grid.
         * If mods are made to the above criteria for disarming traps, then mods
         * must also be made to borg_flow_spread() and borg_flow_direct()
         */

        /* Okay */
        return true;
    }

    /* Ignore other grids */
    return false;
}